

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

void thread_wait(void *thread)

{
  pthread_join((pthread_t)thread,(void **)0x0);
  return;
}

Assistant:

void thread_wait(void *thread)
{
#if defined(CONF_FAMILY_UNIX)
	pthread_join((pthread_t)thread, NULL);
#elif defined(CONF_FAMILY_WINDOWS)
	WaitForSingleObject((HANDLE)thread, INFINITE);
#else
	#error not implemented
#endif
}